

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O2

void blend_color(size_t size,Span *array,void *userData)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  size_t i;
  size_t sVar3;
  Operator op;
  Operator local_70;
  
  getOperator(&local_70,(VSpanData *)userData);
  uVar1 = *(uint32_t *)((long)userData + 0x48);
  for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
    puVar2 = VSpanData::buffer((VSpanData *)userData,(int)array[sVar3].x,(int)array[sVar3].y);
    (*local_70.funcSolid)(puVar2,(int)array[sVar3].len,uVar1,(uint32_t)array[sVar3].coverage);
  }
  return;
}

Assistant:

static void blend_color(size_t size, const VRle::Span *array, void *userData)
{
    VSpanData *data = (VSpanData *)(userData);
    Operator   op = getOperator(data);
    const uint32_t color = data->mSolid;

    for (size_t i = 0 ; i < size; ++i) {
        const auto &span = array[i];
        op.funcSolid(data->buffer(span.x, span.y), span.len, color, span.coverage);
    }
}